

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::update<false,false,true,true,true,1ul,2ul,3ul>(gd *g,base_learner *param_2,example *ec)

{
  double *pdVar1;
  shared_data *psVar2;
  undefined8 in_RAX;
  float fVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  fVar3 = compute_update<false,false,true,true,true,1ul,2ul,3ul>(g,ec);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    uStack_18 = CONCAT44(fVar3 * g->update_multiplier,(int)uStack_18);
    foreach_feature<float,_float_&,_&GD::update_feature>(g->all,ec,(float *)((long)&uStack_18 + 4));
  }
  psVar2 = g->all->sd;
  pdVar1 = &psVar2->contraction;
  if ((*pdVar1 <= 1e-09 && *pdVar1 != 1e-09) || (1000.0 < psVar2->gravity)) {
    sync_weights(g->all);
  }
  return;
}

Assistant:

void update(gd& g, base_learner&, example& ec)
{
  // invariant: not a test label, importance weight > 0
  float update;
  if ((update = compute_update<sparse_l2, invariant, sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare>(
           g, ec)) != 0.)
    train<sqrt_rate, feature_mask_off, adaptive, normalized, spare>(g, ec, update);

  if (g.all->sd->contraction < 1e-9 || g.all->sd->gravity > 1e3)  // updating weights now to avoid numerical instability
    sync_weights(*g.all);
}